

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatterTest_FormatPointer_Test::TestBody(FormatterTest_FormatPointer_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  char *pcVar5;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  string *expected;
  char *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  int line;
  char *in_stack_fffffffffffffd80;
  string *file;
  undefined8 in_stack_fffffffffffffd88;
  Type type;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  char (*in_stack_fffffffffffffd98) [6];
  allocator *format_str;
  undefined7 in_stack_fffffffffffffdd8;
  AssertHelper *this_00;
  string local_200 [32];
  AssertionResult local_1e0 [2];
  void *local_1c0;
  string local_1b8 [32];
  AssertionResult local_198 [2];
  undefined8 local_178;
  string local_170 [39];
  allocator local_149;
  string local_148 [32];
  string local_128 [32];
  AssertionResult local_108 [2];
  undefined8 local_e8;
  string local_e0 [32];
  AssertionResult local_c0 [2];
  char *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  void **in_stack_ffffffffffffff70;
  AssertionResult local_78 [3];
  undefined8 local_48;
  AssertHelper local_40 [4];
  AssertionResult local_20;
  undefined8 local_10;
  
  type = (Type)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  local_10 = 0x1234;
  check_unknown_types<void*>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  local_48 = 0;
  this_00 = local_40;
  fmt::v5::format<char[4],void*>
            ((char (*) [4])in_stack_fffffffffffffd98,
             (void **)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             in_stack_fffffffffffffd70,(char (*) [4])in_stack_fffffffffffffd68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  std::__cxx11::string::~string((string *)local_40);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!(bool)uVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    testing::AssertionResult::failure_message((AssertionResult *)0x172452);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),type,
               in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd70);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar1,in_stack_fffffffffffffdd8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
    testing::Message::~Message((Message *)0x1724af);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x172507);
  fmt::v5::format<char[4],void*>
            ((char (*) [4])in_stack_fffffffffffffd98,
             (void **)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             in_stack_fffffffffffffd70,(char (*) [7])in_stack_fffffffffffffd68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_78);
  if (!bVar2) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    testing::AssertionResult::failure_message((AssertionResult *)0x1725f9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),type,
               in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd70);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar1,in_stack_fffffffffffffdd8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
    testing::Message::~Message((Message *)0x172656);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1726ae);
  local_e8 = 0x1234;
  fmt::v5::format<char[6],void*>
            (in_stack_fffffffffffffd98,
             (void **)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             in_stack_fffffffffffffd70,(char (*) [7])in_stack_fffffffffffffd68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  std::__cxx11::string::~string(local_e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_c0);
  if (!bVar2) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    testing::AssertionResult::failure_message((AssertionResult *)0x1727a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),type,
               in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd70);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar1,in_stack_fffffffffffffdd8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
    testing::Message::~Message((Message *)0x1727fd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x172855);
  format_str = &local_149;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,0x10,'f',format_str);
  std::operator+((char *)in_stack_fffffffffffffd68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  local_178 = 0xffffffffffffffff;
  fmt::v5::format<char[4],void*>
            ((char (*) [4])format_str,
             (void **)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_108);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)CONCAT17(uVar3,in_stack_fffffffffffffd90));
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x172a29);
    type = (Type)((ulong)pcVar5 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffd90),type,
               in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd70);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar1,in_stack_fffffffffffffdd8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
    testing::Message::~Message((Message *)0x172a86);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x172ade);
  local_1c0 = fmt::v5::ptr<int>((int *)0x1234);
  file = local_1b8;
  fmt::v5::format<char[3],void_const*>
            ((char (*) [3])format_str,(void **)CONCAT17(uVar3,in_stack_fffffffffffffd90));
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             in_stack_fffffffffffffd70,(char (*) [7])in_stack_fffffffffffffd68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  std::__cxx11::string::~string(local_1b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_198);
  line = CONCAT13(bVar2,(int3)in_stack_fffffffffffffd7c);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar3,in_stack_fffffffffffffd90));
    in_stack_fffffffffffffd70 =
         testing::AssertionResult::failure_message((AssertionResult *)0x172bd6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffd90),type,(char *)file,line,
               in_stack_fffffffffffffd70);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar1,in_stack_fffffffffffffdd8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
    testing::Message::~Message((Message *)0x172c33);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x172c8b);
  expected = local_200;
  fmt::v5::format<char[3],decltype(nullptr)>
            ((char (*) [3])format_str,(void **)CONCAT17(uVar3,in_stack_fffffffffffffd90));
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(line,in_stack_fffffffffffffd78),in_stack_fffffffffffffd70,
             (char (*) [4])expected,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  std::__cxx11::string::~string(local_200);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(local_1e0);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)CONCAT17(uVar3,in_stack_fffffffffffffd90));
    testing::AssertionResult::failure_message((AssertionResult *)0x172d7d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffd90),type,(char *)file,line,
               in_stack_fffffffffffffd70);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar1,in_stack_fffffffffffffdd8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffffd60));
    testing::Message::~Message((Message *)0x172dd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x172e2d);
  return;
}

Assistant:

TEST(FormatterTest, FormatPointer) {
  check_unknown_types(reinterpret_cast<void*>(0x1234), "p", "pointer");
  EXPECT_EQ("0x0", format("{0}", static_cast<void*>(FMT_NULL)));
  EXPECT_EQ("0x1234", format("{0}", reinterpret_cast<void*>(0x1234)));
  EXPECT_EQ("0x1234", format("{0:p}", reinterpret_cast<void*>(0x1234)));
  EXPECT_EQ("0x" + std::string(sizeof(void*) * CHAR_BIT / 4, 'f'),
      format("{0}", reinterpret_cast<void*>(~uintptr_t())));
  EXPECT_EQ("0x1234", format("{}", fmt::ptr(reinterpret_cast<int*>(0x1234))));
#if FMT_USE_NULLPTR
  EXPECT_EQ("0x0", format("{}", FMT_NULL));
#endif
}